

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O2

int stringToInteger(string *str)

{
  istream *piVar1;
  int value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  istringstream stream;
  uint auStack_170 [88];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)str,_S_in);
  piVar1 = (istream *)std::istream::operator>>((istream *)&stream,&value);
  std::ws<char,std::char_traits<char>>(piVar1);
  if ((*(uint *)((long)auStack_170 + *(long *)(_stream + -0x18)) & 7) != 2) {
    std::operator+(&local_1d0,"stringToInteger: Illegal integer format (",str);
    std::operator+(&local_1b0,&local_1d0,")");
    error(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
  return value;
}

Assistant:

int stringToInteger(string str) {
   istringstream stream(str);
   int value;
   stream >> value >> ws;
   if (stream.fail() || !stream.eof()) {
      error("stringToInteger: Illegal integer format (" + str + ")");
   }
   return value;
}